

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O0

Array<asl::String> * __thiscall
asl::Map<asl::String,_asl::Array<asl::String>_>::operator[]
          (Map<asl::String,_asl::Array<asl::String>_> *this,String *key)

{
  String *n;
  uint k;
  KeyVal *pKVar1;
  Array<asl::String> local_50;
  KeyVal local_48;
  uint local_24;
  String *pSStack_20;
  int i;
  String *key_local;
  Map<asl::String,_asl::Array<asl::String>_> *this_local;
  
  pSStack_20 = key;
  key_local = (String *)this;
  local_24 = indexOf(this,key);
  n = pSStack_20;
  if ((int)local_24 < 0) {
    k = ~local_24;
    Array<asl::String>::Array(&local_50);
    KeyVal::KeyVal(&local_48,n,&local_50);
    Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal>::insert(&this->a,k,&local_48);
    KeyVal::~KeyVal(&local_48);
    Array<asl::String>::~Array(&local_50);
    pKVar1 = Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal>::operator[]
                       (&this->a,-1 - local_24);
  }
  else {
    pKVar1 = Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal>::operator[]
                       (&this->a,local_24);
  }
  this_local = (Map<asl::String,_asl::Array<asl::String>_> *)&pKVar1->value;
  return (Array<asl::String> *)this_local;
}

Assistant:

T& Map<K,T>::operator[](const K& key)
{
	int i = indexOf(key);
	if(i >= 0)
		return a[i].value;
	else
	{
		a.insert(-i-1, KeyVal(key, T()));
		return a[-i-1].value;
	}
}